

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator1.cpp
# Opt level: O0

int main(void)

{
  List<Employee_*> *pLVar1;
  undefined1 local_a0 [8];
  SkipListIterator<Employee_*> iterator;
  Employee *local_80;
  Employee *local_78;
  List<Employee_*> *local_70;
  SkipList<Employee_*> *employees2;
  ReverseListIterator<Employee_*> backward;
  ListIterator<Employee_*> forward;
  Employee *local_30;
  Employee *local_28 [3];
  List<Employee_*> *local_10;
  List<Employee_*> *employees;
  
  pLVar1 = (List<Employee_*> *)operator_new(0x18);
  List<Employee_*>::List(pLVar1,200);
  local_10 = pLVar1;
  local_28[0] = (Employee *)operator_new(1);
  List<Employee_*>::Append(pLVar1,local_28);
  pLVar1 = local_10;
  local_30 = (Employee *)operator_new(1);
  List<Employee_*>::Append(pLVar1,&local_30);
  pLVar1 = local_10;
  forward._current = (long)operator_new(1);
  List<Employee_*>::Append(pLVar1,(Employee **)&forward._current);
  ListIterator<Employee_*>::ListIterator((ListIterator<Employee_*> *)&backward._current,local_10);
  ReverseListIterator<Employee_*>::ReverseListIterator
            ((ReverseListIterator<Employee_*> *)&employees2,local_10);
  PrintEmployees((Iterator<Employee_*> *)&backward._current);
  PrintEmployees((Iterator<Employee_*> *)&employees2);
  pLVar1 = (List<Employee_*> *)operator_new(0x18);
  SkipList<Employee_*>::SkipList((SkipList<Employee_*> *)pLVar1);
  local_70 = pLVar1;
  local_78 = (Employee *)operator_new(1);
  List<Employee_*>::Append(pLVar1,&local_78);
  pLVar1 = local_70;
  local_80 = (Employee *)operator_new(1);
  List<Employee_*>::Append(pLVar1,&local_80);
  pLVar1 = local_70;
  iterator.super_ListIterator<Employee_*>._current = (long)operator_new(1);
  List<Employee_*>::Append(pLVar1,(Employee **)&iterator.super_ListIterator<Employee_*>._current);
  SkipListIterator<Employee_*>::SkipListIterator((SkipListIterator<Employee_*> *)local_a0,local_70);
  PrintEmployees((Iterator<Employee_*> *)local_a0);
  return 0;
}

Assistant:

int main()
{
    // EXAMPLE 1: List

    List<Employee*>* employees;

    employees = new List<Employee*>;
    employees->Append(new Employee);
    employees->Append(new Employee);
    employees->Append(new Employee);

    ListIterator<Employee*> forward(employees);
    ReverseListIterator<Employee*> backward(employees);

    PrintEmployees(forward);
    PrintEmployees(backward);


    // EXAMPLE 2: SkipList

    SkipList<Employee*>* employees2;

    employees2 = new SkipList<Employee*>;
    employees2->Append(new Employee);
    employees2->Append(new Employee);
    employees2->Append(new Employee);

    SkipListIterator<Employee*> iterator(employees2);
    PrintEmployees(iterator);

}